

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx::ConeCurveMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  RayHit *pRVar33;
  long lVar35;
  float fVar36;
  float fVar45;
  float fVar46;
  undefined1 auVar37 [16];
  float fVar47;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar66;
  float fVar67;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar82;
  float fVar83;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar84;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  float fVar100;
  float fVar113;
  float fVar114;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  undefined1 auVar112 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar122;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  float fVar132;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  float fVar145;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  RoundLineIntersectorHitM<4> hit;
  undefined1 local_30c [20];
  undefined1 local_2f8 [16];
  RTCFilterFunctionNArguments local_2e8;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  float local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  ulong uVar34;
  undefined1 auVar81 [64];
  
  pSVar7 = context->scene;
  uVar30 = (line->v0).field_0.i[0];
  pGVar8 = (pSVar7->geometries).items[line->sharedGeomID].ptr;
  lVar35 = *(long *)&pGVar8[1].time_range.upper;
  p_Var9 = pGVar8[1].intersectionFilterN;
  auVar48 = *(undefined1 (*) [16])(lVar35 + (ulong)uVar30 * (long)p_Var9);
  uVar4 = (line->v0).field_0.i[1];
  auVar39 = *(undefined1 (*) [16])(lVar35 + (ulong)uVar4 * (long)p_Var9);
  uVar5 = (line->v0).field_0.i[2];
  auVar51 = *(undefined1 (*) [16])(lVar35 + (ulong)uVar5 * (long)p_Var9);
  uVar6 = (line->v0).field_0.i[3];
  auVar52 = *(undefined1 (*) [16])(lVar35 + (ulong)uVar6 * (long)p_Var9);
  auVar40 = vunpcklps_avx(auVar48,auVar51);
  auVar48 = vunpckhps_avx(auVar48,auVar51);
  auVar51 = vunpcklps_avx(auVar39,auVar52);
  auVar39 = vunpckhps_avx(auVar39,auVar52);
  auVar61 = vunpcklps_avx(auVar40,auVar51);
  auVar60 = vunpckhps_avx(auVar40,auVar51);
  auVar102 = vunpcklps_avx(auVar48,auVar39);
  auVar50 = vunpckhps_avx(auVar48,auVar39);
  auVar48 = *(undefined1 (*) [16])(lVar35 + (ulong)(uVar30 + 1) * (long)p_Var9);
  auVar39 = *(undefined1 (*) [16])(lVar35 + (ulong)(uVar4 + 1) * (long)p_Var9);
  auVar51 = *(undefined1 (*) [16])(lVar35 + (ulong)(uVar5 + 1) * (long)p_Var9);
  auVar52 = *(undefined1 (*) [16])(lVar35 + (ulong)(uVar6 + 1) * (long)p_Var9);
  auVar40 = vpunpckldq_avx(auVar48,auVar51);
  auVar48 = vpunpckhdq_avx(auVar48,auVar51);
  auVar51 = vpunpckldq_avx(auVar39,auVar52);
  auVar39 = vpunpckhdq_avx(auVar39,auVar52);
  auVar53 = vpunpckldq_avx(auVar40,auVar51);
  auVar51 = vpunpckhdq_avx(auVar40,auVar51);
  auVar40 = vpunpckldq_avx(auVar48,auVar39);
  auVar52 = vpunpckhdq_avx(auVar48,auVar39);
  auVar48 = vpcmpeqd_avx(auVar52,auVar52);
  auVar39 = vpcmpeqd_avx(auVar48,(undefined1  [16])(line->primIDs).field_0);
  local_b8 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  fVar1 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar37._4_4_ = fVar1;
  auVar37._0_4_ = fVar1;
  auVar37._8_4_ = fVar1;
  auVar37._12_4_ = fVar1;
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar58 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar48 = ZEXT416((uint)(fVar3 * fVar3 + fVar58 * fVar58 + fVar2 * fVar2));
  auVar68 = vshufps_avx(auVar48,auVar48,0);
  auVar48 = vrcpps_avx(auVar68);
  fVar58 = auVar48._0_4_;
  auVar49._0_4_ = fVar58 * auVar68._0_4_;
  fVar66 = auVar48._4_4_;
  auVar49._4_4_ = fVar66 * auVar68._4_4_;
  fVar67 = auVar48._8_4_;
  auVar49._8_4_ = fVar67 * auVar68._8_4_;
  fVar100 = auVar48._12_4_;
  auVar49._12_4_ = fVar100 * auVar68._12_4_;
  auVar68._8_4_ = 0x3f800000;
  auVar68._0_8_ = &DAT_3f8000003f800000;
  auVar68._12_4_ = 0x3f800000;
  auVar48 = vsubps_avx(auVar68,auVar49);
  auVar59._0_4_ = (auVar53._0_4_ + auVar61._0_4_) * 0.5;
  auVar59._4_4_ = (auVar53._4_4_ + auVar61._4_4_) * 0.5;
  auVar59._8_4_ = (auVar53._8_4_ + auVar61._8_4_) * 0.5;
  auVar59._12_4_ = (auVar53._12_4_ + auVar61._12_4_) * 0.5;
  auVar69._0_4_ = (auVar51._0_4_ + auVar60._0_4_) * 0.5;
  auVar69._4_4_ = (auVar51._4_4_ + auVar60._4_4_) * 0.5;
  auVar69._8_4_ = (auVar51._8_4_ + auVar60._8_4_) * 0.5;
  auVar69._12_4_ = (auVar51._12_4_ + auVar60._12_4_) * 0.5;
  auVar74._0_4_ = (auVar102._0_4_ + auVar40._0_4_) * 0.5;
  auVar74._4_4_ = (auVar102._4_4_ + auVar40._4_4_) * 0.5;
  auVar74._8_4_ = (auVar102._8_4_ + auVar40._8_4_) * 0.5;
  auVar74._12_4_ = (auVar102._12_4_ + auVar40._12_4_) * 0.5;
  fVar2 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar101._4_4_ = fVar2;
  auVar101._0_4_ = fVar2;
  auVar101._8_4_ = fVar2;
  auVar101._12_4_ = fVar2;
  auVar68 = vsubps_avx(auVar69,auVar37);
  auVar37 = vsubps_avx(auVar74,auVar101);
  local_118 = (ray->super_RayK<1>).dir.field_0.m128[2];
  local_158 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar75._4_4_ = fVar3;
  auVar75._0_4_ = fVar3;
  auVar75._8_4_ = fVar3;
  auVar75._12_4_ = fVar3;
  auVar49 = vsubps_avx(auVar59,auVar75);
  local_108 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_1f8._0_4_ =
       (local_108 * auVar49._0_4_ + auVar68._0_4_ * local_158 + local_118 * auVar37._0_4_) *
       (fVar58 + fVar58 * auVar48._0_4_);
  local_1f8._4_4_ =
       (local_108 * auVar49._4_4_ + auVar68._4_4_ * local_158 + local_118 * auVar37._4_4_) *
       (fVar66 + fVar66 * auVar48._4_4_);
  fStack_1f0 = (local_108 * auVar49._8_4_ + auVar68._8_4_ * local_158 + local_118 * auVar37._8_4_) *
               (fVar67 + fVar67 * auVar48._8_4_);
  fStack_1ec = (local_108 * auVar49._12_4_ + auVar68._12_4_ * local_158 + local_118 * auVar37._12_4_
               ) * (fVar100 + fVar100 * auVar48._12_4_);
  auVar153._0_4_ = fVar3 + local_108 * (float)local_1f8._0_4_;
  auVar153._4_4_ = fVar3 + local_108 * (float)local_1f8._4_4_;
  auVar153._8_4_ = fVar3 + local_108 * fStack_1f0;
  auVar153._12_4_ = fVar3 + local_108 * fStack_1ec;
  auVar76._0_4_ = fVar1 + local_158 * (float)local_1f8._0_4_;
  auVar76._4_4_ = fVar1 + local_158 * (float)local_1f8._4_4_;
  auVar76._8_4_ = fVar1 + local_158 * fStack_1f0;
  auVar76._12_4_ = fVar1 + local_158 * fStack_1ec;
  auVar151._0_4_ = fVar2 + local_118 * (float)local_1f8._0_4_;
  auVar151._4_4_ = fVar2 + local_118 * (float)local_1f8._4_4_;
  auVar151._8_4_ = fVar2 + local_118 * fStack_1f0;
  auVar151._12_4_ = fVar2 + local_118 * fStack_1ec;
  auVar68 = vsubps_avx(auVar51,auVar60);
  local_128 = vsubps_avx(auVar40,auVar102);
  fVar1 = local_128._0_4_;
  fVar10 = local_128._4_4_;
  fVar16 = local_128._8_4_;
  fVar22 = local_128._12_4_;
  fVar2 = auVar68._0_4_;
  fVar11 = auVar68._4_4_;
  fVar17 = auVar68._8_4_;
  fVar23 = auVar68._12_4_;
  local_1e8 = vsubps_avx(auVar53,auVar61);
  fVar3 = local_1e8._0_4_;
  fVar12 = local_1e8._4_4_;
  fVar18 = local_1e8._8_4_;
  fVar24 = local_1e8._12_4_;
  fVar132 = fVar3 * fVar3 + fVar2 * fVar2 + fVar1 * fVar1;
  fVar139 = fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10;
  fVar140 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  fVar141 = fVar24 * fVar24 + fVar23 * fVar23 + fVar22 * fVar22;
  local_298 = vsubps_avx(auVar76,auVar60);
  local_138 = vsubps_avx(auVar151,auVar102);
  fVar58 = local_138._0_4_;
  fVar13 = local_138._4_4_;
  fVar19 = local_138._8_4_;
  fVar25 = local_138._12_4_;
  fVar66 = local_298._0_4_;
  fVar14 = local_298._4_4_;
  fVar20 = local_298._8_4_;
  fVar26 = local_298._12_4_;
  local_1d8 = vsubps_avx(auVar153,auVar61);
  fVar121 = local_1d8._0_4_;
  fVar126 = local_1d8._4_4_;
  fVar128 = local_1d8._8_4_;
  fVar130 = local_1d8._12_4_;
  fVar145 = fVar121 * fVar3 + fVar2 * fVar66 + fVar1 * fVar58;
  fVar148 = fVar126 * fVar12 + fVar11 * fVar14 + fVar10 * fVar13;
  fVar149 = fVar128 * fVar18 + fVar17 * fVar20 + fVar16 * fVar19;
  fVar150 = fVar130 * fVar24 + fVar23 * fVar26 + fVar22 * fVar25;
  auVar142._0_4_ = local_108 * fVar3 + fVar2 * local_158 + local_118 * fVar1;
  auVar142._4_4_ = local_108 * fVar12 + fVar11 * local_158 + local_118 * fVar10;
  auVar142._8_4_ = local_108 * fVar18 + fVar17 * local_158 + local_118 * fVar16;
  auVar142._12_4_ = local_108 * fVar24 + fVar23 * local_158 + local_118 * fVar22;
  fStack_114 = local_118;
  fStack_110 = local_118;
  fStack_10c = local_118;
  auVar48 = vsubps_avx(auVar50,auVar52);
  fVar67 = auVar48._0_4_;
  fVar15 = auVar48._4_4_;
  fVar21 = auVar48._8_4_;
  fVar27 = auVar48._12_4_;
  fVar36 = fVar132 + fVar67 * fVar67;
  fVar45 = fVar139 + fVar15 * fVar15;
  fVar46 = fVar140 + fVar21 * fVar21;
  fVar47 = fVar141 + fVar27 * fVar27;
  local_c8._0_4_ = fVar132 * fVar132;
  local_c8._4_4_ = fVar139 * fVar139;
  fStack_c0 = fVar140 * fVar140;
  fStack_bc = fVar141 * fVar141;
  auVar48._0_4_ =
       (float)local_c8._0_4_ * (local_108 * fVar121 + local_158 * fVar66 + local_118 * fVar58);
  auVar48._4_4_ =
       (float)local_c8._4_4_ * (local_108 * fVar126 + local_158 * fVar14 + local_118 * fVar13);
  auVar48._8_4_ = fStack_c0 * (local_108 * fVar128 + local_158 * fVar20 + local_118 * fVar19);
  auVar48._12_4_ = fStack_bc * (local_108 * fVar130 + local_158 * fVar26 + local_118 * fVar25);
  auVar102._0_4_ = fVar36 * auVar142._0_4_ * fVar145;
  auVar102._4_4_ = fVar45 * auVar142._4_4_ * fVar148;
  auVar102._8_4_ = fVar46 * auVar142._8_4_ * fVar149;
  auVar102._12_4_ = fVar47 * auVar142._12_4_ * fVar150;
  auVar48 = vsubps_avx(auVar48,auVar102);
  fVar100 = auVar50._0_4_;
  auVar103._0_4_ = fVar132 * fVar100;
  fVar113 = auVar50._4_4_;
  auVar103._4_4_ = fVar139 * fVar113;
  fVar114 = auVar50._8_4_;
  auVar103._8_4_ = fVar140 * fVar114;
  fVar115 = auVar50._12_4_;
  auVar103._12_4_ = fVar141 * fVar115;
  auVar50._0_4_ = auVar142._0_4_ * fVar67 * auVar103._0_4_ + auVar48._0_4_;
  auVar50._4_4_ = auVar142._4_4_ * fVar15 * auVar103._4_4_ + auVar48._4_4_;
  auVar50._8_4_ = auVar142._8_4_ * fVar21 * auVar103._8_4_ + auVar48._8_4_;
  auVar50._12_4_ = auVar142._12_4_ * fVar27 * auVar103._12_4_ + auVar48._12_4_;
  auVar60._0_4_ = (float)local_c8._0_4_ * (fVar121 * fVar121 + fVar66 * fVar66 + fVar58 * fVar58);
  auVar60._4_4_ = (float)local_c8._4_4_ * (fVar126 * fVar126 + fVar14 * fVar14 + fVar13 * fVar13);
  auVar60._8_4_ = fStack_c0 * (fVar128 * fVar128 + fVar20 * fVar20 + fVar19 * fVar19);
  auVar60._12_4_ = fStack_bc * (fVar130 * fVar130 + fVar26 * fVar26 + fVar25 * fVar25);
  auVar116._0_4_ = fVar145 * fVar145 * fVar36;
  auVar116._4_4_ = fVar148 * fVar148 * fVar45;
  auVar116._8_4_ = fVar149 * fVar149 * fVar46;
  auVar116._12_4_ = fVar150 * fVar150 * fVar47;
  auVar48 = vsubps_avx(auVar60,auVar116);
  auVar117._0_4_ = (fVar67 + fVar67) * fVar145;
  auVar117._4_4_ = (fVar15 + fVar15) * fVar148;
  auVar117._8_4_ = (fVar21 + fVar21) * fVar149;
  auVar117._12_4_ = (fVar27 + fVar27) * fVar150;
  auVar37 = vsubps_avx(auVar117,auVar103);
  fVar73 = auVar142._0_4_ * auVar142._0_4_;
  fVar82 = auVar142._4_4_ * auVar142._4_4_;
  fVar83 = auVar142._8_4_ * auVar142._8_4_;
  fVar84 = auVar142._12_4_ * auVar142._12_4_;
  auVar61._0_4_ = fVar36 * fVar73;
  auVar61._4_4_ = fVar45 * fVar82;
  auVar61._8_4_ = fVar46 * fVar83;
  auVar61._12_4_ = fVar47 * fVar84;
  auVar49 = vsubps_avx(_local_c8,auVar61);
  auVar104._0_4_ = auVar49._0_4_ * (auVar48._0_4_ + auVar37._0_4_ * auVar103._0_4_);
  auVar104._4_4_ = auVar49._4_4_ * (auVar48._4_4_ + auVar37._4_4_ * auVar103._4_4_);
  auVar104._8_4_ = auVar49._8_4_ * (auVar48._8_4_ + auVar37._8_4_ * auVar103._8_4_);
  auVar104._12_4_ = auVar49._12_4_ * (auVar48._12_4_ + auVar37._12_4_ * auVar103._12_4_);
  auVar118._0_4_ = auVar50._0_4_ * auVar50._0_4_;
  auVar118._4_4_ = auVar50._4_4_ * auVar50._4_4_;
  auVar118._8_4_ = auVar50._8_4_ * auVar50._8_4_;
  auVar118._12_4_ = auVar50._12_4_ * auVar50._12_4_;
  auVar37 = vsubps_avx(auVar118,auVar104);
  auVar48 = vcmpps_avx(auVar37,ZEXT416(0) << 0x20,5);
  auVar60 = auVar48 & ~auVar39;
  if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar60[0xf] < '\0') {
    auVar60 = vandnps_avx(auVar39,auVar48);
    auVar53 = vsubps_avx(auVar153,auVar53);
    auVar61 = vsubps_avx(auVar76,auVar51);
    auVar102 = vsubps_avx(auVar151,auVar40);
    auVar48 = vrcpps_avx(auVar49);
    fVar122 = auVar48._0_4_;
    auVar133._0_4_ = fVar122 * auVar49._0_4_;
    fVar127 = auVar48._4_4_;
    auVar133._4_4_ = fVar127 * auVar49._4_4_;
    fVar129 = auVar48._8_4_;
    auVar133._8_4_ = fVar129 * auVar49._8_4_;
    fVar131 = auVar48._12_4_;
    auVar133._12_4_ = fVar131 * auVar49._12_4_;
    local_168 = auVar68;
    auVar70._8_4_ = 0x3f800000;
    auVar70._0_8_ = &DAT_3f8000003f800000;
    auVar70._12_4_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar70,auVar133);
    fVar122 = fVar122 + fVar122 * auVar48._0_4_;
    fVar127 = fVar127 + fVar127 * auVar48._4_4_;
    fVar129 = fVar129 + fVar129 * auVar48._8_4_;
    fVar131 = fVar131 + fVar131 * auVar48._12_4_;
    auVar134._8_4_ = 0x7fffffff;
    auVar134._0_8_ = 0x7fffffff7fffffff;
    auVar134._12_4_ = 0x7fffffff;
    auVar48 = vandps_avx(auVar134,auVar49);
    auVar135._8_4_ = 0x219392ef;
    auVar135._0_8_ = 0x219392ef219392ef;
    auVar135._12_4_ = 0x219392ef;
    auVar48 = vcmpps_avx(auVar48,auVar135,2);
    auVar39 = vsqrtps_avx(auVar37);
    uVar34 = CONCAT44(auVar50._4_4_,auVar50._0_4_);
    auVar136._0_8_ = uVar34 ^ 0x8000000080000000;
    auVar136._8_4_ = -auVar50._8_4_;
    auVar136._12_4_ = -auVar50._12_4_;
    auVar51 = vsubps_avx(auVar136,auVar39);
    auVar39 = vsubps_avx(auVar39,auVar50);
    auVar105._0_4_ = auVar51._0_4_ * fVar122;
    auVar105._4_4_ = auVar51._4_4_ * fVar127;
    auVar105._8_4_ = auVar51._8_4_ * fVar129;
    auVar105._12_4_ = auVar51._12_4_ * fVar131;
    auVar51._0_4_ = fVar122 * auVar39._0_4_;
    auVar51._4_4_ = fVar127 * auVar39._4_4_;
    auVar51._8_4_ = fVar129 * auVar39._8_4_;
    auVar51._12_4_ = fVar131 * auVar39._12_4_;
    auVar38._8_4_ = 0xff800000;
    auVar38._0_8_ = 0xff800000ff800000;
    auVar38._12_4_ = 0xff800000;
    auVar39 = vblendvps_avx(auVar105,auVar38,auVar48);
    auVar137._8_4_ = 0x7f800000;
    auVar137._0_8_ = 0x7f8000007f800000;
    auVar137._12_4_ = 0x7f800000;
    auVar51 = vblendvps_avx(auVar51,auVar137,auVar48);
    auVar91._0_4_ = fVar145 + auVar142._0_4_ * auVar39._0_4_;
    auVar91._4_4_ = fVar148 + auVar142._4_4_ * auVar39._4_4_;
    auVar91._8_4_ = fVar149 + auVar142._8_4_ * auVar39._8_4_;
    auVar91._12_4_ = fVar150 + auVar142._12_4_ * auVar39._12_4_;
    auVar48 = vcmpps_avx(auVar91,ZEXT816(0) << 0x20,6);
    auVar28._4_4_ = fVar139;
    auVar28._0_4_ = fVar132;
    auVar28._8_4_ = fVar140;
    auVar28._12_4_ = fVar141;
    auVar40 = vcmpps_avx(auVar91,auVar28,1);
    auVar48 = vandps_avx(auVar40,auVar48);
    auVar48 = vandps_avx(auVar60,auVar48);
    local_258 = vblendvps_avx(auVar137,auVar39,auVar48);
    local_228._0_4_ = fVar145 + auVar142._0_4_ * auVar51._0_4_;
    local_228._4_4_ = fVar148 + auVar142._4_4_ * auVar51._4_4_;
    fStack_220 = fVar149 + auVar142._8_4_ * auVar51._8_4_;
    fStack_21c = fVar150 + auVar142._12_4_ * auVar51._12_4_;
    auVar48 = vcmpps_avx(_local_228,ZEXT816(0) << 0x20,6);
    auVar39 = vcmpps_avx(_local_228,auVar28,1);
    auVar48 = vandps_avx(auVar39,auVar48);
    auVar48 = vandps_avx(auVar60,auVar48);
    local_238 = vblendvps_avx(auVar38,auVar51,auVar48);
    auVar48 = vrcpps_avx(auVar142);
    fVar122 = auVar48._0_4_;
    auVar62._0_4_ = auVar142._0_4_ * fVar122;
    fVar127 = auVar48._4_4_;
    auVar62._4_4_ = auVar142._4_4_ * fVar127;
    fVar129 = auVar48._8_4_;
    auVar62._8_4_ = auVar142._8_4_ * fVar129;
    fVar131 = auVar48._12_4_;
    auVar62._12_4_ = auVar142._12_4_ * fVar131;
    auVar48 = vsubps_avx(auVar70,auVar62);
    fVar122 = fVar122 + fVar122 * auVar48._0_4_;
    fVar127 = fVar127 + fVar127 * auVar48._4_4_;
    fVar129 = fVar129 + fVar129 * auVar48._8_4_;
    fVar131 = fVar131 + fVar131 * auVar48._12_4_;
    auVar63._0_4_ = auVar142._0_4_ * fVar121;
    auVar63._4_4_ = auVar142._4_4_ * fVar126;
    auVar63._8_4_ = auVar142._8_4_ * fVar128;
    auVar63._12_4_ = auVar142._12_4_ * fVar130;
    auVar92._0_4_ = local_108 * fVar145;
    auVar92._4_4_ = local_108 * fVar148;
    auVar92._8_4_ = local_108 * fVar149;
    auVar92._12_4_ = local_108 * fVar150;
    auVar48 = vsubps_avx(auVar63,auVar92);
    auVar93._0_4_ = auVar142._0_4_ * fVar66;
    auVar93._4_4_ = auVar142._4_4_ * fVar14;
    auVar93._8_4_ = auVar142._8_4_ * fVar20;
    auVar93._12_4_ = auVar142._12_4_ * fVar26;
    auVar106._0_4_ = local_158 * fVar145;
    auVar106._4_4_ = local_158 * fVar148;
    auVar106._8_4_ = local_158 * fVar149;
    auVar106._12_4_ = local_158 * fVar150;
    auVar39 = vsubps_avx(auVar93,auVar106);
    auVar107._0_4_ = auVar142._0_4_ * fVar58;
    auVar107._4_4_ = auVar142._4_4_ * fVar13;
    auVar107._8_4_ = auVar142._8_4_ * fVar19;
    auVar107._12_4_ = auVar142._12_4_ * fVar25;
    fStack_154 = local_158;
    fStack_150 = local_158;
    fStack_14c = local_158;
    auVar154._0_4_ = local_118 * fVar145;
    auVar154._4_4_ = local_118 * fVar148;
    auVar154._8_4_ = local_118 * fVar149;
    auVar154._12_4_ = local_118 * fVar150;
    auVar51 = vsubps_avx(auVar107,auVar154);
    auVar64._0_4_ =
         auVar48._0_4_ * auVar48._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar51._0_4_ * auVar51._0_4_;
    auVar64._4_4_ =
         auVar48._4_4_ * auVar48._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar51._4_4_ * auVar51._4_4_;
    auVar64._8_4_ =
         auVar48._8_4_ * auVar48._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar51._8_4_ * auVar51._8_4_;
    auVar64._12_4_ =
         auVar48._12_4_ * auVar48._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar51._12_4_ * auVar51._12_4_;
    auVar94._0_4_ = fVar73 * fVar100 * fVar100;
    auVar94._4_4_ = fVar82 * fVar113 * fVar113;
    auVar94._8_4_ = fVar83 * fVar114 * fVar114;
    auVar94._12_4_ = fVar84 * fVar115 * fVar115;
    auVar48 = vcmpps_avx(auVar64,auVar94,1);
    auVar146._8_4_ = 0x7f800000;
    auVar146._0_8_ = 0x7f8000007f800000;
    auVar146._12_4_ = 0x7f800000;
    auVar95._0_4_ = fVar122 * -fVar145;
    auVar95._4_4_ = fVar127 * -fVar148;
    auVar95._8_4_ = fVar129 * -fVar149;
    auVar95._12_4_ = fVar131 * -fVar150;
    auVar39 = vblendvps_avx(auVar146,auVar95,auVar48);
    auVar48 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar60);
    local_248 = vblendvps_avx(auVar146,auVar39,auVar48);
    local_2b8._0_4_ = auVar53._0_4_;
    local_2b8._4_4_ = auVar53._4_4_;
    fStack_2b0 = auVar53._8_4_;
    fStack_2ac = auVar53._12_4_;
    fVar145 = (float)local_2b8._0_4_ * fVar3 + fVar2 * auVar61._0_4_ + auVar102._0_4_ * fVar1;
    fVar148 = (float)local_2b8._4_4_ * fVar12 + fVar11 * auVar61._4_4_ + auVar102._4_4_ * fVar10;
    fVar149 = fStack_2b0 * fVar18 + fVar17 * auVar61._8_4_ + auVar102._8_4_ * fVar16;
    fVar150 = fStack_2ac * fVar24 + fVar23 * auVar61._12_4_ + auVar102._12_4_ * fVar22;
    auVar96._0_4_ = auVar142._0_4_ * (float)local_2b8._0_4_;
    auVar96._4_4_ = auVar142._4_4_ * (float)local_2b8._4_4_;
    auVar96._8_4_ = auVar142._8_4_ * fStack_2b0;
    auVar96._12_4_ = auVar142._12_4_ * fStack_2ac;
    auVar39._0_4_ = auVar142._0_4_ * auVar61._0_4_;
    auVar39._4_4_ = auVar142._4_4_ * auVar61._4_4_;
    auVar39._8_4_ = auVar142._8_4_ * auVar61._8_4_;
    auVar39._12_4_ = auVar142._12_4_ * auVar61._12_4_;
    auVar77._0_4_ = auVar142._0_4_ * auVar102._0_4_;
    auVar77._4_4_ = auVar142._4_4_ * auVar102._4_4_;
    auVar77._8_4_ = auVar142._8_4_ * auVar102._8_4_;
    auVar77._12_4_ = auVar142._12_4_ * auVar102._12_4_;
    auVar108._0_4_ = local_108 * fVar145;
    auVar108._4_4_ = local_108 * fVar148;
    auVar108._8_4_ = local_108 * fVar149;
    auVar108._12_4_ = local_108 * fVar150;
    auVar48 = vsubps_avx(auVar96,auVar108);
    auVar109._0_4_ = local_158 * fVar145;
    auVar109._4_4_ = local_158 * fVar148;
    auVar109._8_4_ = local_158 * fVar149;
    auVar109._12_4_ = local_158 * fVar150;
    auVar39 = vsubps_avx(auVar39,auVar109);
    auVar110._0_4_ = local_118 * fVar145;
    auVar110._4_4_ = local_118 * fVar148;
    auVar110._8_4_ = local_118 * fVar149;
    auVar110._12_4_ = local_118 * fVar150;
    auVar51 = vsubps_avx(auVar77,auVar110);
    auVar40._0_4_ =
         auVar48._0_4_ * auVar48._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar51._0_4_ * auVar51._0_4_;
    auVar40._4_4_ =
         auVar48._4_4_ * auVar48._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar51._4_4_ * auVar51._4_4_;
    auVar40._8_4_ =
         auVar48._8_4_ * auVar48._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar51._8_4_ * auVar51._8_4_;
    auVar40._12_4_ =
         auVar48._12_4_ * auVar48._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar51._12_4_ * auVar51._12_4_;
    local_2a8._0_4_ = auVar52._0_4_;
    local_2a8._4_4_ = auVar52._4_4_;
    fStack_2a0 = auVar52._8_4_;
    fStack_29c = auVar52._12_4_;
    auVar78._0_4_ = fVar73 * (float)local_2a8._0_4_ * (float)local_2a8._0_4_;
    auVar78._4_4_ = fVar82 * (float)local_2a8._4_4_ * (float)local_2a8._4_4_;
    auVar78._8_4_ = fVar83 * fStack_2a0 * fStack_2a0;
    auVar78._12_4_ = fVar84 * fStack_29c * fStack_29c;
    uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar97._4_4_ = uVar32;
    auVar97._0_4_ = uVar32;
    auVar97._8_4_ = uVar32;
    auVar97._12_4_ = uVar32;
    auVar48 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar60);
    auVar39 = vcmpps_avx(auVar40,auVar78,1);
    auVar52._0_4_ = fVar122 * -fVar145;
    auVar52._4_4_ = fVar127 * -fVar148;
    auVar52._8_4_ = fVar129 * -fVar149;
    auVar52._12_4_ = fVar131 * -fVar150;
    auVar39 = vblendvps_avx(auVar146,auVar52,auVar39);
    auVar48 = vblendvps_avx(auVar146,auVar39,auVar48);
    auVar52 = vminps_avx(local_248,auVar48);
    auVar39 = vmaxps_avx(local_248,auVar48);
    auVar40 = vminps_avx(local_258,auVar52);
    auVar48 = vcmpps_avx(auVar146,auVar39,0);
    auVar156._8_4_ = 0xff800000;
    auVar156._0_8_ = 0xff800000ff800000;
    auVar156._12_4_ = 0xff800000;
    auVar48 = vblendvps_avx(auVar39,auVar156,auVar48);
    auVar51 = vcmpps_avx(auVar40,auVar52,0);
    auVar39 = vcmpps_avx(auVar146,auVar52,0);
    auVar39 = vblendvps_avx(auVar52,auVar156,auVar39);
    auVar48 = vblendvps_avx(auVar39,auVar48,auVar51);
    local_48 = vmaxps_avx(local_238,auVar48);
    auVar53._0_4_ = (float)local_1f8._0_4_ + auVar40._0_4_;
    auVar53._4_4_ = (float)local_1f8._4_4_ + auVar40._4_4_;
    auVar53._8_4_ = fStack_1f0 + auVar40._8_4_;
    auVar53._12_4_ = fStack_1ec + auVar40._12_4_;
    auVar48 = vcmpps_avx(auVar97,auVar53,2);
    fVar73 = (ray->super_RayK<1>).tfar;
    auVar79._4_4_ = fVar73;
    auVar79._0_4_ = fVar73;
    auVar79._8_4_ = fVar73;
    auVar79._12_4_ = fVar73;
    auVar39 = vcmpps_avx(auVar53,auVar79,2);
    auVar48 = vandps_avx(auVar48,auVar39);
    auVar39 = vcmpps_avx(auVar146,auVar40,4);
    local_218 = vandps_avx(auVar48,auVar39);
    local_2a8._0_4_ = (float)local_1f8._0_4_ + local_48._0_4_;
    local_2a8._4_4_ = (float)local_1f8._4_4_ + local_48._4_4_;
    fStack_2a0 = fStack_1f0 + local_48._8_4_;
    fStack_29c = fStack_1ec + local_48._12_4_;
    auVar48 = vcmpps_avx(auVar97,_local_2a8,2);
    auVar39 = vcmpps_avx(_local_2a8,auVar79,2);
    auVar48 = vandps_avx(auVar48,auVar39);
    auVar39 = vandps_avx(local_218,auVar60);
    auVar51 = vcmpps_avx(auVar156,local_48,4);
    auVar51 = vandps_avx(auVar60,auVar51);
    local_208 = vandps_avx(auVar48,auVar51);
    local_2f8 = vorps_avx(auVar39,local_208);
    if ((((local_2f8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_2f8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_2f8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_2f8[0xf] < '\0') {
      auVar51 = vblendvps_avx(local_48,auVar40,auVar39);
      fStack_104 = local_108;
      fStack_100 = local_108;
      fStack_fc = local_108;
      auVar52 = vblendvps_avx(_local_228,auVar91,auVar39);
      auVar29._4_4_ = fVar139;
      auVar29._0_4_ = fVar132;
      auVar29._8_4_ = fVar140;
      auVar29._12_4_ = fVar141;
      fVar100 = fVar132 * fVar67 * fVar100;
      fVar113 = fVar139 * fVar15 * fVar113;
      fVar114 = fVar140 * fVar21 * fVar114;
      fVar115 = fVar141 * fVar27 * fVar115;
      auVar48 = vcmpps_avx(auVar51,local_258,0);
      auVar39 = vcmpps_avx(auVar51,local_238,0);
      auVar48 = vorps_avx(auVar48,auVar39);
      auVar48 = vandps_avx(auVar60,auVar48);
      auVar39 = vcmpps_avx(local_248,auVar51,0);
      auVar39 = vandps_avx(auVar60,auVar39);
      fVar67 = auVar51._0_4_;
      fVar21 = auVar51._4_4_;
      fVar27 = auVar51._8_4_;
      fVar73 = auVar51._12_4_;
      local_58 = fVar3 * fVar100;
      fStack_54 = fVar12 * fVar113;
      fStack_50 = fVar18 * fVar114;
      fStack_4c = fVar24 * fVar115;
      auVar65._0_4_ = fVar3 * fVar100 + (float)local_c8._0_4_ * (local_108 * fVar67 + fVar121);
      auVar65._4_4_ = fVar12 * fVar113 + (float)local_c8._4_4_ * (local_108 * fVar21 + fVar126);
      auVar65._8_4_ = fVar18 * fVar114 + fStack_c0 * (local_108 * fVar27 + fVar128);
      auVar65._12_4_ = fVar24 * fVar115 + fStack_bc * (local_108 * fVar73 + fVar130);
      local_78 = fVar3 * fVar36;
      fStack_74 = fVar12 * fVar45;
      fStack_70 = fVar18 * fVar46;
      fStack_6c = fVar24 * fVar47;
      fVar15 = auVar52._0_4_;
      auVar123._0_4_ = fVar3 * fVar36 * fVar15;
      fVar3 = auVar52._4_4_;
      auVar123._4_4_ = fVar12 * fVar45 * fVar3;
      fVar12 = auVar52._8_4_;
      auVar123._8_4_ = fVar18 * fVar46 * fVar12;
      fVar82 = auVar52._12_4_;
      auVar123._12_4_ = fVar24 * fVar47 * fVar82;
      auVar52 = vsubps_avx(auVar65,auVar123);
      local_68 = fVar2 * fVar100;
      fStack_64 = fVar11 * fVar113;
      fStack_60 = fVar17 * fVar114;
      fStack_5c = fVar23 * fVar115;
      auVar124._0_4_ = fVar2 * fVar100 + (fVar67 * local_158 + fVar66) * (float)local_c8._0_4_;
      auVar124._4_4_ = fVar11 * fVar113 + (fVar21 * local_158 + fVar14) * (float)local_c8._4_4_;
      auVar124._8_4_ = fVar17 * fVar114 + (fVar27 * local_158 + fVar20) * fStack_c0;
      auVar124._12_4_ = fVar23 * fVar115 + (fVar73 * local_158 + fVar26) * fStack_bc;
      fStack_f4 = fVar11 * fVar45;
      local_f8 = fVar2 * fVar36;
      fStack_f0 = fVar17 * fVar46;
      fStack_ec = fVar23 * fVar47;
      auVar138._0_4_ = fVar15 * fVar2 * fVar36;
      auVar138._4_4_ = fVar3 * fVar11 * fVar45;
      auVar138._8_4_ = fVar12 * fVar17 * fVar46;
      auVar138._12_4_ = fVar82 * fVar23 * fVar47;
      local_98._0_8_ = local_1e8._0_8_ ^ 0x8000000080000000;
      local_98._8_4_ = -fVar18;
      local_98._12_4_ = -fVar24;
      auVar51 = vblendvps_avx(local_1e8,local_98,auVar39);
      auVar40 = vsubps_avx(auVar124,auVar138);
      _local_2b8 = vblendvps_avx(auVar51,auVar52,auVar48);
      local_a8._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
      local_a8._8_4_ = -fVar17;
      local_a8._12_4_ = -fVar23;
      auVar51 = vblendvps_avx(auVar68,local_a8,auVar39);
      local_188 = vblendvps_avx(auVar51,auVar40,auVar48);
      auVar51 = vrcpps_avx(auVar29);
      local_148 = auVar51._0_4_;
      auVar71._0_4_ = local_148 * fVar132;
      fStack_144 = auVar51._4_4_;
      auVar71._4_4_ = fStack_144 * fVar139;
      fStack_140 = auVar51._8_4_;
      auVar71._8_4_ = fStack_140 * fVar140;
      fStack_13c = auVar51._12_4_;
      auVar71._12_4_ = fStack_13c * fVar141;
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = &DAT_3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar143,auVar71);
      local_148 = local_148 + local_148 * auVar51._0_4_;
      fStack_144 = fStack_144 + fStack_144 * auVar51._4_4_;
      fStack_140 = fStack_140 + fStack_140 * auVar51._8_4_;
      fStack_13c = fStack_13c + fStack_13c * auVar51._12_4_;
      auVar112 = ZEXT1664(CONCAT412(local_118,CONCAT48(local_118,CONCAT44(local_118,local_118))));
      auVar155 = ZEXT1664(local_138);
      local_88 = fVar1 * fVar100;
      fStack_84 = fVar10 * fVar113;
      fStack_80 = fVar16 * fVar114;
      fStack_7c = fVar22 * fVar115;
      auVar72._0_4_ = fVar1 * fVar100 + (float)local_c8._0_4_ * (fVar58 + local_118 * fVar67);
      auVar72._4_4_ = fVar10 * fVar113 + (float)local_c8._4_4_ * (fVar13 + local_118 * fVar21);
      auVar72._8_4_ = fVar16 * fVar114 + fStack_c0 * (fVar19 + local_118 * fVar27);
      auVar72._12_4_ = fVar22 * fVar115 + fStack_bc * (fVar25 + local_118 * fVar73);
      local_e8 = fVar1 * fVar36;
      fStack_e4 = fVar10 * fVar45;
      fStack_e0 = fVar16 * fVar46;
      fStack_dc = fVar22 * fVar47;
      auVar85._0_4_ = fVar1 * fVar36 * fVar15;
      auVar85._4_4_ = fVar10 * fVar45 * fVar3;
      auVar85._8_4_ = fVar16 * fVar46 * fVar12;
      auVar85._12_4_ = fVar22 * fVar47 * fVar82;
      auVar52 = vsubps_avx(auVar72,auVar85);
      auVar80._0_8_ = local_128._0_8_ ^ 0x8000000080000000;
      auVar80._8_4_ = -fVar16;
      auVar80._12_4_ = -fVar22;
      auVar81 = ZEXT1664(auVar80);
      auVar51 = vblendvps_avx(local_128,auVar80,auVar39);
      local_178 = vblendvps_avx(auVar51,auVar52,auVar48);
      auVar39 = vandnps_avx(auVar39,auVar143);
      auVar147 = ZEXT1664(auVar39);
      auVar54._0_4_ = local_148 * fVar15;
      auVar54._4_4_ = fStack_144 * fVar3;
      auVar54._8_4_ = fStack_140 * fVar12;
      auVar54._12_4_ = fStack_13c * fVar82;
      local_1c8 = vblendvps_avx(auVar39,auVar54,auVar48);
      local_1a8._0_4_ = fVar67 + (float)local_1f8._0_4_;
      local_1a8._4_4_ = fVar21 + (float)local_1f8._4_4_;
      local_1a8._8_4_ = fVar27 + fStack_1f0;
      local_1a8._12_4_ = fVar73 + fStack_1ec;
      auVar99 = ZEXT1664(local_1a8);
      local_1b8 = ZEXT816(0);
      local_198 = _local_2b8;
      auVar41._8_4_ = 0x7f800000;
      auVar41._0_8_ = 0x7f8000007f800000;
      auVar41._12_4_ = 0x7f800000;
      auVar48 = vblendvps_avx(auVar41,local_1a8,local_2f8);
      auVar39 = vshufps_avx(auVar48,auVar48,0xb1);
      auVar39 = vminps_avx(auVar39,auVar48);
      auVar51 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar51,auVar39);
      local_30c._4_16_ = local_2f8;
      auVar48 = vcmpps_avx(auVar48,auVar39,0);
      auVar51 = local_2f8 & auVar48;
      auVar39 = vpcmpeqd_avx(auVar39,auVar39);
      auVar120 = ZEXT1664(CONCAT412(local_158,CONCAT48(local_158,CONCAT44(local_158,local_158))));
      auVar157 = ZEXT1664(CONCAT412(local_108,CONCAT48(local_108,CONCAT44(local_108,local_108))));
      auVar152 = ZEXT1664(local_128);
      if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar51[0xf] < '\0'
         ) {
        auVar39 = auVar48;
      }
      auVar48 = vandps_avx(local_2f8,auVar39);
      uVar30 = vmovmskps_avx(auVar48);
      lVar35 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      auVar125 = ZEXT1664(local_298);
      auVar144 = ZEXT1664(local_1d8);
      auVar90 = ZEXT1664(local_1e8);
LAB_00ea7d42:
      auVar40 = auVar125._0_16_;
      auVar52 = auVar120._0_16_;
      auVar51 = auVar112._0_16_;
      auVar60 = auVar155._0_16_;
      auVar49 = auVar152._0_16_;
      auVar37 = auVar147._0_16_;
      auVar53 = auVar144._0_16_;
      auVar50 = auVar157._0_16_;
      auVar48 = auVar81._0_16_;
      auVar39 = auVar90._0_16_;
      local_270 = *(uint *)(local_b8 + lVar35 * 4);
      pRVar33 = (RayHit *)(ulong)local_270;
      pGVar8 = (pSVar7->geometries).items[(long)pRVar33].ptr;
      if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
        *(undefined4 *)(local_30c + lVar35 * 4 + 4) = 0;
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          fVar1 = *(float *)(local_1c8 + lVar35 * 4);
          fVar2 = *(float *)(local_1b8 + lVar35 * 4);
          (ray->super_RayK<1>).tfar = *(float *)(local_1a8 + lVar35 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_198 + lVar35 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_188 + lVar35 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_178 + lVar35 * 4);
          ray->u = fVar1;
          ray->v = fVar2;
          ray->primID = (line->primIDs).field_0.i[lVar35];
          ray->geomID = local_270;
          ray->instID[0] = context->user->instID[0];
          uVar32 = 0;
          ray->instPrimID[0] = context->user->instPrimID[0];
LAB_00ea8100:
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar43._4_4_ = fVar1;
          auVar43._0_4_ = fVar1;
          auVar43._8_4_ = fVar1;
          auVar43._12_4_ = fVar1;
          auVar61 = vcmpps_avx(_local_2a8,auVar43,2);
          auVar61 = vandps_avx(auVar61,local_218);
          auVar102 = local_208 & auVar61;
          if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar102 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar102 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar102[0xf]) {
            return;
          }
          auVar102 = vcmpps_avx(local_48,local_248,0);
          auVar39 = vblendvps_avx(auVar39,local_98,auVar102);
          auVar68 = vblendvps_avx(auVar68,local_a8,auVar102);
          auVar48 = vblendvps_avx(auVar49,auVar48,auVar102);
          auVar49 = vcmpps_avx(local_48,local_258,0);
          auVar102 = vcmpps_avx(local_48,local_238,0);
          auVar49 = vorps_avx(auVar49,auVar102);
          fVar1 = local_48._0_4_;
          fVar2 = local_48._4_4_;
          fVar3 = local_48._8_4_;
          fVar58 = local_48._12_4_;
          auVar86._0_4_ = (float)local_c8._0_4_ * (auVar53._0_4_ + auVar50._0_4_ * fVar1) + local_58
          ;
          auVar86._4_4_ =
               (float)local_c8._4_4_ * (auVar53._4_4_ + auVar50._4_4_ * fVar2) + fStack_54;
          auVar86._8_4_ = fStack_c0 * (auVar53._8_4_ + auVar50._8_4_ * fVar3) + fStack_50;
          auVar86._12_4_ = fStack_bc * (auVar53._12_4_ + auVar50._12_4_ * fVar58) + fStack_4c;
          auVar98._0_4_ = (float)local_c8._0_4_ * (auVar40._0_4_ + auVar52._0_4_ * fVar1) + local_68
          ;
          auVar98._4_4_ =
               (float)local_c8._4_4_ * (auVar40._4_4_ + auVar52._4_4_ * fVar2) + fStack_64;
          auVar98._8_4_ = fStack_c0 * (auVar40._8_4_ + auVar52._8_4_ * fVar3) + fStack_60;
          auVar98._12_4_ = fStack_bc * (auVar40._12_4_ + auVar52._12_4_ * fVar58) + fStack_5c;
          auVar111._0_4_ =
               (float)local_c8._0_4_ * (auVar60._0_4_ + auVar51._0_4_ * fVar1) + local_88;
          auVar111._4_4_ =
               (float)local_c8._4_4_ * (auVar60._4_4_ + auVar51._4_4_ * fVar2) + fStack_84;
          auVar111._8_4_ = fStack_c0 * (auVar60._8_4_ + auVar51._8_4_ * fVar3) + fStack_80;
          auVar111._12_4_ = fStack_bc * (auVar60._12_4_ + auVar51._12_4_ * fVar58) + fStack_7c;
          auVar119._0_4_ = (float)local_228._0_4_ * local_78;
          auVar119._4_4_ = (float)local_228._4_4_ * fStack_74;
          auVar119._8_4_ = fStack_220 * fStack_70;
          auVar119._12_4_ = fStack_21c * fStack_6c;
          auVar51 = vsubps_avx(auVar86,auVar119);
          local_198 = vblendvps_avx(auVar39,auVar51,auVar49);
          auVar87._0_4_ = (float)local_228._0_4_ * local_f8;
          auVar87._4_4_ = (float)local_228._4_4_ * fStack_f4;
          auVar87._8_4_ = fStack_220 * fStack_f0;
          auVar87._12_4_ = fStack_21c * fStack_ec;
          auVar39 = vsubps_avx(auVar98,auVar87);
          local_188 = vblendvps_avx(auVar68,auVar39,auVar49);
          auVar88._0_4_ = (float)local_228._0_4_ * local_e8;
          auVar88._4_4_ = (float)local_228._4_4_ * fStack_e4;
          auVar88._8_4_ = fStack_220 * fStack_e0;
          auVar88._12_4_ = fStack_21c * fStack_dc;
          auVar39 = vsubps_avx(auVar111,auVar88);
          local_178 = vblendvps_avx(auVar48,auVar39,auVar49);
          auVar89._0_4_ = (float)local_228._0_4_ * local_148;
          auVar89._4_4_ = (float)local_228._4_4_ * fStack_144;
          auVar89._8_4_ = fStack_220 * fStack_140;
          auVar89._12_4_ = fStack_21c * fStack_13c;
          local_1c8 = vblendvps_avx(auVar37,auVar89,auVar49);
          auVar48 = vandps_avx(local_208,auVar61);
          local_1b8 = ZEXT816(0) << 0x20;
          local_1a8 = _local_2a8;
          auVar56._8_4_ = 0x7f800000;
          auVar56._0_8_ = 0x7f8000007f800000;
          auVar56._12_4_ = 0x7f800000;
          auVar39 = vblendvps_avx(auVar56,_local_2a8,auVar48);
          auVar51 = vshufps_avx(auVar39,auVar39,0xb1);
          auVar51 = vminps_avx(auVar51,auVar39);
          auVar52 = vshufpd_avx(auVar51,auVar51,1);
          auVar51 = vminps_avx(auVar52,auVar51);
          auVar39 = vcmpps_avx(auVar39,auVar51,0);
          pSVar7 = context->scene;
          local_30c._4_16_ = auVar48;
          auVar51 = auVar48 & auVar39;
          if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar51[0xf] < '\0') {
            auVar48 = vandps_avx(auVar39,auVar48);
          }
          uVar31 = vmovmskps_avx(auVar48);
          lVar35 = 0;
          if (CONCAT44(uVar32,uVar31) != 0) {
            for (; (CONCAT44(uVar32,uVar31) >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          do {
            local_270 = *(uint *)(local_b8 + lVar35 * 4);
            pRVar33 = (RayHit *)(ulong)local_270;
            pGVar8 = (pSVar7->geometries).items[(long)pRVar33].ptr;
            if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
              *(undefined4 *)(local_30c + lVar35 * 4 + 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar1 = *(float *)(local_1c8 + lVar35 * 4);
                fVar2 = *(float *)(local_1b8 + lVar35 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_1a8 + lVar35 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_198 + lVar35 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_188 + lVar35 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_178 + lVar35 * 4);
                ray->u = fVar1;
                ray->v = fVar2;
                ray->primID = (line->primIDs).field_0.i[lVar35];
                ray->geomID = local_270;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_288 = *(float *)(local_198 + lVar35 * 4);
              local_284 = *(undefined4 *)(local_188 + lVar35 * 4);
              local_280 = *(undefined4 *)(local_178 + lVar35 * 4);
              local_27c = *(undefined4 *)(local_1c8 + lVar35 * 4);
              local_278 = *(undefined4 *)(local_1b8 + lVar35 * 4);
              local_274 = (line->primIDs).field_0.i[lVar35];
              local_26c = context->user->instID[0];
              local_268 = context->user->instPrimID[0];
              local_2f8._0_4_ = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_1a8 + lVar35 * 4);
              local_30c._0_4_ = -NAN;
              local_2e8.valid = (int *)local_30c;
              local_2e8.geometryUserPtr = pGVar8->userPtr;
              local_2e8.context = context->user;
              local_2e8.ray = (RTCRayN *)ray;
              local_2e8.hit = (RTCHitN *)&local_288;
              local_2e8.N = 1;
              if ((pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar8->intersectionFilterN)(&local_2e8),
                 (((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] != 0.0)) {
                p_Var9 = context->args->filter;
                if (p_Var9 != (RTCFilterFunctionN)0x0) {
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var9)(&local_2e8);
                  }
                  if ((((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] == 0.0) goto LAB_00ea84ca;
                }
                (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_2e8.hit;
                (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_2e8.hit + 4);
                (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_2e8.hit + 8);
                *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc);
                *(float *)((long)local_2e8.ray + 0x40) = *(float *)(local_2e8.hit + 0x10);
                *(float *)((long)local_2e8.ray + 0x44) = *(float *)(local_2e8.hit + 0x14);
                *(float *)((long)local_2e8.ray + 0x48) = *(float *)(local_2e8.hit + 0x18);
                *(float *)((long)local_2e8.ray + 0x4c) = *(float *)(local_2e8.hit + 0x1c);
                *(float *)((long)local_2e8.ray + 0x50) = *(float *)(local_2e8.hit + 0x20);
                pRVar33 = (RayHit *)local_2e8.ray;
              }
              else {
LAB_00ea84ca:
                (ray->super_RayK<1>).tfar = (float)local_2f8._0_4_;
                pRVar33 = (RayHit *)local_2e8.valid;
              }
              *(undefined4 *)(local_30c + lVar35 * 4 + 4) = 0;
              fVar1 = (ray->super_RayK<1>).tfar;
              auVar44._4_4_ = fVar1;
              auVar44._0_4_ = fVar1;
              auVar44._8_4_ = fVar1;
              auVar44._12_4_ = fVar1;
              auVar48 = vcmpps_avx(_local_2a8,auVar44,2);
              local_30c._4_16_ = vandps_avx(auVar48,local_30c._4_16_);
            }
            if ((((local_30c._4_16_ >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_30c._4_16_ >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_30c._4_16_ >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_30c[0x13]) {
              return;
            }
            auVar57._8_4_ = 0x7f800000;
            auVar57._0_8_ = 0x7f8000007f800000;
            auVar57._12_4_ = 0x7f800000;
            auVar48 = vblendvps_avx(auVar57,_local_2a8,local_30c._4_16_);
            auVar39 = vshufps_avx(auVar48,auVar48,0xb1);
            auVar39 = vminps_avx(auVar39,auVar48);
            auVar51 = vshufpd_avx(auVar39,auVar39,1);
            auVar39 = vminps_avx(auVar51,auVar39);
            auVar39 = vcmpps_avx(auVar48,auVar39,0);
            auVar51 = local_30c._4_16_ & auVar39;
            auVar48 = local_30c._4_16_;
            if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar51[0xf] < '\0') {
              auVar48 = vandps_avx(auVar39,local_30c._4_16_);
            }
            uVar32 = vmovmskps_avx(auVar48);
            uVar34 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar32);
            lVar35 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
          } while( true );
        }
        local_2f8 = auVar48;
        local_288 = *(float *)(local_198 + lVar35 * 4);
        local_284 = *(undefined4 *)(local_188 + lVar35 * 4);
        local_280 = *(undefined4 *)(local_178 + lVar35 * 4);
        local_27c = *(undefined4 *)(local_1c8 + lVar35 * 4);
        local_278 = *(undefined4 *)(local_1b8 + lVar35 * 4);
        local_274 = (line->primIDs).field_0.i[lVar35];
        local_26c = context->user->instID[0];
        local_268 = context->user->instPrimID[0];
        local_2b8._0_4_ = (ray->super_RayK<1>).tfar;
        (ray->super_RayK<1>).tfar = *(float *)(local_1a8 + lVar35 * 4);
        local_30c._0_4_ = -NAN;
        local_2e8.valid = (int *)local_30c;
        local_2e8.geometryUserPtr = pGVar8->userPtr;
        local_2e8.context = context->user;
        local_2e8.ray = (RTCRayN *)ray;
        local_2e8.hit = (RTCHitN *)&local_288;
        local_2e8.N = 1;
        local_d8 = auVar37;
        _local_1f8 = auVar99._0_16_;
        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ea7efe:
          p_Var9 = context->args->filter;
          if (p_Var9 != (RTCFilterFunctionN)0x0) {
            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
              (*p_Var9)(&local_2e8);
              auVar99 = ZEXT1664(_local_1f8);
              auVar147 = ZEXT1664(local_d8);
              auVar90 = ZEXT1664(local_1e8);
              auVar144 = ZEXT1664(local_1d8);
              auVar155 = ZEXT1664(local_138);
              auVar125 = ZEXT1664(local_298);
              auVar152 = ZEXT1664(local_128);
              auVar157 = ZEXT1664(CONCAT412(fStack_fc,
                                            CONCAT48(fStack_100,CONCAT44(fStack_104,local_108))));
              auVar120 = ZEXT1664(CONCAT412(fStack_14c,
                                            CONCAT48(fStack_150,CONCAT44(fStack_154,local_158))));
              auVar112 = ZEXT1664(CONCAT412(fStack_10c,
                                            CONCAT48(fStack_110,CONCAT44(fStack_114,local_118))));
              auVar68 = local_168;
            }
            if ((((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] == 0.0) goto LAB_00ea8059;
          }
          (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.x = *(float *)local_2e8.hit;
          (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_2e8.hit + 4);
          (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_2e8.hit + 8);
          *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc);
          *(float *)((long)local_2e8.ray + 0x40) = *(float *)(local_2e8.hit + 0x10);
          *(float *)((long)local_2e8.ray + 0x44) = *(float *)(local_2e8.hit + 0x14);
          *(float *)((long)local_2e8.ray + 0x48) = *(float *)(local_2e8.hit + 0x18);
          *(float *)((long)local_2e8.ray + 0x4c) = *(float *)(local_2e8.hit + 0x1c);
          *(float *)((long)local_2e8.ray + 0x50) = *(float *)(local_2e8.hit + 0x20);
          pRVar33 = (RayHit *)local_2e8.ray;
        }
        else {
          (*pGVar8->intersectionFilterN)(&local_2e8);
          auVar99 = ZEXT1664(_local_1f8);
          auVar147 = ZEXT1664(local_d8);
          auVar90 = ZEXT1664(local_1e8);
          auVar144 = ZEXT1664(local_1d8);
          auVar155 = ZEXT1664(local_138);
          auVar125 = ZEXT1664(local_298);
          auVar152 = ZEXT1664(local_128);
          auVar157 = ZEXT1664(CONCAT412(fStack_fc,
                                        CONCAT48(fStack_100,CONCAT44(fStack_104,local_108))));
          auVar120 = ZEXT1664(CONCAT412(fStack_14c,
                                        CONCAT48(fStack_150,CONCAT44(fStack_154,local_158))));
          auVar112 = ZEXT1664(CONCAT412(fStack_10c,
                                        CONCAT48(fStack_110,CONCAT44(fStack_114,local_118))));
          auVar68 = local_168;
          if ((((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] != 0.0) goto LAB_00ea7efe;
LAB_00ea8059:
          (ray->super_RayK<1>).tfar = (float)local_2b8._0_4_;
          pRVar33 = (RayHit *)local_2e8.valid;
        }
        *(undefined4 *)(local_30c + lVar35 * 4 + 4) = 0;
        fVar1 = (ray->super_RayK<1>).tfar;
        auVar42._4_4_ = fVar1;
        auVar42._0_4_ = fVar1;
        auVar42._8_4_ = fVar1;
        auVar42._12_4_ = fVar1;
        auVar48 = vcmpps_avx(auVar99._0_16_,auVar42,2);
        local_30c._4_16_ = vandps_avx(auVar48,local_30c._4_16_);
        auVar81 = ZEXT1664(local_2f8);
      }
      uVar32 = (undefined4)((ulong)pRVar33 >> 0x20);
      auVar40 = auVar125._0_16_;
      auVar52 = auVar120._0_16_;
      auVar51 = auVar112._0_16_;
      auVar60 = auVar155._0_16_;
      auVar49 = auVar152._0_16_;
      auVar37 = auVar147._0_16_;
      auVar53 = auVar144._0_16_;
      auVar50 = auVar157._0_16_;
      auVar48 = auVar81._0_16_;
      auVar39 = auVar90._0_16_;
      if ((((local_30c._4_16_ >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_30c._4_16_ >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_30c._4_16_ >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_30c[0x13]) goto LAB_00ea8100;
      auVar55._8_4_ = 0x7f800000;
      auVar55._0_8_ = 0x7f8000007f800000;
      auVar55._12_4_ = 0x7f800000;
      auVar48 = vblendvps_avx(auVar55,auVar99._0_16_,local_30c._4_16_);
      auVar39 = vshufps_avx(auVar48,auVar48,0xb1);
      auVar39 = vminps_avx(auVar39,auVar48);
      auVar51 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar51,auVar39);
      auVar39 = vcmpps_avx(auVar48,auVar39,0);
      auVar51 = local_30c._4_16_ & auVar39;
      auVar48 = local_30c._4_16_;
      if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar51[0xf] < '\0'
         ) {
        auVar48 = vandps_avx(auVar39,local_30c._4_16_);
      }
      uVar31 = vmovmskps_avx(auVar48);
      lVar35 = 0;
      if (CONCAT44(uVar32,uVar31) != 0) {
        for (; (CONCAT44(uVar32,uVar31) >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      goto LAB_00ea7d42;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }